

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

void testing::internal::
     GenerateNamesRecursively<testing::internal::DefaultNameGenerator,testing::internal::Types<phmap::node_hash_set<phmap::priv::hash_internal::Enum,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>,phmap::node_hash_set<phmap::priv::hash_internal::EnumClass,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>>>
               (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *param_1,
               int param_2)

{
  string asStackY_38 [4];
  int in_stack_ffffffffffffffcc;
  
  DefaultNameGenerator::
  GetName<phmap::node_hash_set<phmap::priv::hash_internal::Enum,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>>
            (in_stack_ffffffffffffffcc);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (param_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     asStackY_38);
  std::__cxx11::string::~string(asStackY_38);
  GenerateNamesRecursively<testing::internal::DefaultNameGenerator,testing::internal::Types<phmap::node_hash_set<phmap::priv::hash_internal::EnumClass,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>>>
            (param_1,param_2 + 1);
  return;
}

Assistant:

void GenerateNamesRecursively(Types, std::vector<std::string>* result, int i) {
  result->push_back(NameGenerator::template GetName<typename Types::Head>(i));
  GenerateNamesRecursively<NameGenerator>(typename Types::Tail(), result,
                                          i + 1);
}